

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O2

bool __thiscall ON_Mesh::EvaluatePoint(ON_Mesh *this,ON_ObjRef *objref,ON_3dPoint *P)

{
  TYPE TVar1;
  uint uVar2;
  int iVar3;
  ON_MeshFace *pOVar4;
  ON_MeshTopologyVertex *pOVar5;
  int *piVar6;
  double dVar7;
  bool bVar8;
  ulong uVar9;
  ON_Line L;
  ON_3dPoint local_140;
  ON_Line local_128;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  P->z = ON_3dPoint::UnsetPoint.z;
  dVar7 = ON_3dPoint::UnsetPoint.y;
  P->x = ON_3dPoint::UnsetPoint.x;
  P->y = dVar7;
  TVar1 = (objref->m_component_index).m_type;
  if (3 < TVar1 - mesh_vertex) goto LAB_0054a90e;
  uVar2 = (objref->m_component_index).m_index;
  uVar9 = (ulong)uVar2;
  switch(TVar1) {
  case mesh_vertex:
    if (((int)uVar2 < 0) || ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count <= (int)uVar2))
    goto LAB_0054a90e;
    break;
  case meshtop_vertex:
    if (((int)uVar2 < 0) || ((this->m_top).m_topv.m_count <= (int)uVar2)) goto LAB_0054a90e;
    pOVar5 = (this->m_top).m_topv.m_a;
    if ((pOVar5[uVar9].m_v_count < 1) || (piVar6 = pOVar5[uVar9].m_vi, piVar6 == (int *)0x0))
    goto LAB_0054a90e;
    iVar3 = *piVar6;
    uVar9 = (ulong)iVar3;
    if (((long)uVar9 < 0) || ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count <= iVar3))
    goto LAB_0054a90e;
    break;
  case meshtop_edge:
    if (((objref->m_evp).m_t_type == 5) &&
       (ABS((objref->m_evp).m_t[0] + (objref->m_evp).m_t[1] + -1.0) <= 1.490116119385e-08)) {
      ON_MeshTopology::TopEdgeLine(&local_128,&this->m_top,uVar2);
      bVar8 = ON_Line::IsValid(&local_128);
      if (bVar8) {
        ON_Line::PointAt(&local_140,&local_128,(objref->m_evp).m_t[0]);
        P->z = local_140.z;
        P->x = local_140.x;
        P->y = local_140.y;
      }
      ON_Line::~ON_Line(&local_128);
    }
    goto LAB_0054a90e;
  case mesh_face:
    if (((((objref->m_evp).m_t_type == 4) &&
         (ABS((objref->m_evp).m_t[0] + (objref->m_evp).m_t[1] + (objref->m_evp).m_t[2] +
              (objref->m_evp).m_t[3] + -1.0) <= 1.490116119385e-08)) && (-1 < (int)uVar2)) &&
       ((int)uVar2 < (this->m_F).m_count)) {
      pOVar4 = (this->m_F).m_a;
      iVar3 = pOVar4[uVar9].vi[0];
      if (((-1 < (long)iVar3) &&
          (uVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, iVar3 < (int)uVar2)) &&
         (((uint)pOVar4[uVar9].vi[1] < uVar2 && -1 < pOVar4[uVar9].vi[1] &&
          (((uint)pOVar4[uVar9].vi[2] < uVar2 && -1 < pOVar4[uVar9].vi[2] &&
           ((uint)pOVar4[uVar9].vi[3] < uVar2 && -1 < pOVar4[uVar9].vi[3])))))) {
        ON_3dPoint::operator=
                  (&local_128.from,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + iVar3);
        ON_3dPoint::operator=
                  (&local_128.to,
                   (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar4[uVar9].vi[1]);
        ON_3dPoint::operator=
                  (&local_f8,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar4[uVar9].vi[2])
        ;
        ON_3dPoint::operator=
                  (&local_e0,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar4[uVar9].vi[3])
        ;
        ::operator*(&local_78,(objref->m_evp).m_t[0],&local_128.from);
        ::operator*(&local_90,(objref->m_evp).m_t[1],&local_128.to);
        ON_3dPoint::operator+(&local_60,&local_78,&local_90);
        ::operator*(&local_a8,(objref->m_evp).m_t[2],&local_f8);
        ON_3dPoint::operator+(&local_48,&local_60,&local_a8);
        ::operator*(&local_c0,(objref->m_evp).m_t[3],&local_e0);
        ON_3dPoint::operator+(&local_140,&local_48,&local_c0);
        P->z = local_140.z;
        P->x = local_140.x;
        P->y = local_140.y;
      }
    }
    goto LAB_0054a90e;
  }
  ON_3dPoint::operator=(P,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar9);
LAB_0054a90e:
  bVar8 = ON_3dPoint::IsValid(P);
  return bVar8;
}

Assistant:

bool ON_Mesh::EvaluatePoint( const class ON_ObjRef& objref, ON_3dPoint& P ) const
{
  // virtual function default
  P = ON_3dPoint::UnsetPoint;
  ON_COMPONENT_INDEX ci = objref.m_component_index;

  switch ( ci.m_type )
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if ( ci.m_index >= 0 && ci.m_index < m_V.Count() )
      P = m_V[ci.m_index];
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( ci.m_index >= 0 && ci.m_index < m_top.m_topv.Count() )
    {
      const ON_MeshTopologyVertex& topv = m_top.m_topv[ci.m_index];
      if ( topv.m_v_count > 0 && topv.m_vi )
      {
        int vi = topv.m_vi[0];
        if ( vi >= 0 && vi < m_V.Count() )
          P = m_V[vi];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( 5 == objref.m_evp.m_t_type 
         && fabs(objref.m_evp.m_t[0] + objref.m_evp.m_t[1] - 1.0) <= ON_SQRT_EPSILON )
    {
      ON_Line L = m_top.TopEdgeLine(ci.m_index);
      if ( L.IsValid() )
      {
        P = L.PointAt(objref.m_evp.m_t[0]);
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if ( 4 == objref.m_evp.m_t_type 
         && fabs(objref.m_evp.m_t[0] + objref.m_evp.m_t[1] + objref.m_evp.m_t[2] + objref.m_evp.m_t[3] - 1.0) <= ON_SQRT_EPSILON )
    {
      if ( ci.m_index >= 0 && ci.m_index < m_F.Count() )
      {
        const int* fvi = m_F[ci.m_index].vi;
        if ( fvi[0] < 0 || fvi[0] >= m_V.Count() )
          break;
        if ( fvi[1] < 0 || fvi[1] >= m_V.Count() )
          break;
        if ( fvi[2] < 0 || fvi[2] >= m_V.Count() )
          break;
        if ( fvi[3] < 0 || fvi[3] >= m_V.Count() )
          break;
        ON_3dPoint V[4];
        V[0] = m_V[fvi[0]];
        V[1] = m_V[fvi[1]];
        V[2] = m_V[fvi[2]];
        V[3] = m_V[fvi[3]];
        P = objref.m_evp.m_t[0]*V[0] + objref.m_evp.m_t[1]*V[1] + objref.m_evp.m_t[2]*V[2] + objref.m_evp.m_t[3]*V[3];
      }
    }
    break;

  default:
    // intentionally skipping other ON_COMPONENT_INDEX::TYPE enum values
    break;
  }

  return P.IsValid();
}